

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<void_*(*)(Js::RecyclableObject_*,_Js::CallInfo,_...),_Js::JavascriptFunction_*,_Memory::Recycler,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<void_*(*)(Js::RecyclableObject_*,_Js::CallInfo,____),_Js::JavascriptFunction_*,_Memory::Recycler,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  uint newSize;
  Type TVar1;
  uint uVar2;
  int iVar3;
  hash_t hVar4;
  EntryType *dst;
  int *piVar5;
  long lVar6;
  long lVar7;
  Type local_48;
  int *newBuckets;
  int local_34 [2];
  int modIndex;
  
  newSize = this->count * 2;
  local_34[0] = 0x4b;
  uVar2 = 4;
  if (8 < newSize) {
    uVar2 = this->count & 0x7fffffff;
  }
  uVar2 = PrimePolicy::GetPrime(uVar2,local_34);
  local_48.ptr = (int *)0x0;
  newBuckets = (int *)0x0;
  if (uVar2 == this->bucketCount) {
    dst = AllocateEntries(this,newSize,true);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<Memory::WriteBarrierPtr<void*(Js::RecyclableObject*,Js::CallInfo,___)>,Memory::WriteBarrierPtr<Js::JavascriptFunction>>,Memory::WriteBarrierPtr<Js::JavascriptFunction>,Memory::Recycler>
              (dst,(long)(int)newSize,(this->entries).ptr,(long)this->count);
    DeleteEntries(this,(this->entries).ptr,this->size);
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr = dst;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    this->size = newSize;
    this->modFunctionIndex = local_34[0];
  }
  else {
    Allocate(this,&local_48.ptr,(EntryType **)&newBuckets,uVar2,newSize);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<Memory::WriteBarrierPtr<void*(Js::RecyclableObject*,Js::CallInfo,___)>,Memory::WriteBarrierPtr<Js::JavascriptFunction>>,Memory::WriteBarrierPtr<Js::JavascriptFunction>,Memory::Recycler>
              ((SimpleDictionaryEntry<Memory::WriteBarrierPtr<void_*(Js::RecyclableObject_*,_Js::CallInfo,____)>,_Memory::WriteBarrierPtr<Js::JavascriptFunction>_>
                *)newBuckets,(long)(int)newSize,(this->entries).ptr,(long)this->count);
    this->modFunctionIndex = local_34[0];
    iVar3 = this->count;
    if (0 < iVar3) {
      lVar6 = 8;
      lVar7 = 0;
      piVar5 = newBuckets;
      do {
        if (-2 < *(int *)((long)piVar5 + lVar6)) {
          hVar4 = PrimePolicy::ModPrime
                            ((uint)(*(ulong *)((long)piVar5 + lVar6 + 8) >> 4) & 0x7fffffff,uVar2,
                             this->modFunctionIndex);
          *(int *)((long)newBuckets + lVar6) = local_48.ptr[(int)hVar4];
          local_48.ptr[(int)hVar4] = (int)lVar7;
          iVar3 = this->count;
          piVar5 = newBuckets;
        }
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x18;
      } while (lVar7 < iVar3);
    }
    DeleteBuckets(this,(this->buckets).ptr,this->bucketCount);
    DeleteEntries(this,(this->entries).ptr,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    TVar1.ptr = local_48.ptr;
    Memory::Recycler::WBSetBit((char *)this);
    (this->buckets).ptr = TVar1.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    piVar5 = newBuckets;
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr =
         (SimpleDictionaryEntry<Memory::WriteBarrierPtr<void_*(Js::RecyclableObject_*,_Js::CallInfo,____)>,_Memory::WriteBarrierPtr<Js::JavascriptFunction>_>
          *)piVar5;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    this->bucketCount = uVar2;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }